

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O0

value_type_conflict1
amrex::fudetail::ReduceSum_host<amrex::FArrayBox,PeleLM::getCellsCount()::__2,void>
          (FabArray<amrex::FArrayBox> *fa,IntVect *nghost,anon_class_1_0_00000001 *f)

{
  bool bVar1;
  anon_class_1_0_00000001 *in_RDX;
  Real RVar2;
  Array4<const_double> *arr;
  Box *bx;
  MFIter mfi;
  value_type sm;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_ffffffffffffff10;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff18;
  bool in_stack_ffffffffffffff37;
  FabArrayBase *in_stack_ffffffffffffff38;
  MFIter *in_stack_ffffffffffffff40;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  MFIter *in_stack_ffffffffffffff50;
  Box local_a4;
  Box *local_88;
  MFIter local_80;
  double local_20;
  anon_class_1_0_00000001 *local_18;
  
  local_20 = 0.0;
  local_18 = in_RDX;
  MFIter::MFIter(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff37);
  while( true ) {
    bVar1 = MFIter::isValid(&local_80);
    if (!bVar1) break;
    MFIter::growntilebox(in_stack_ffffffffffffff50,(IntVect *)in_stack_ffffffffffffff48);
    local_88 = &local_a4;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffff18,(MFIter *)in_stack_ffffffffffffff10._M_head_impl);
    in_stack_ffffffffffffff50 = (MFIter *)&stack0xffffffffffffff10;
    RVar2 = PeleLM::getCellsCount::anon_class_1_0_00000001::operator()
                      (local_18,local_88,(Array4<const_double> *)in_stack_ffffffffffffff50);
    local_20 = RVar2 + local_20;
    MFIter::operator++(&local_80);
  }
  MFIter::~MFIter((MFIter *)in_stack_ffffffffffffff10._M_head_impl);
  return local_20;
}

Assistant:

typename FAB::value_type
ReduceSum_host (FabArray<FAB> const& fa, IntVect const& nghost, F&& f)
{
    using value_type = typename FAB::value_type;
    value_type sm = 0;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
    for (MFIter mfi(fa,true); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(nghost);
        auto const& arr = fa.const_array(mfi);
        sm += f(bx, arr);
    }

    return sm;
}